

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_variantSetStmt
                   (string *__return_storage_ptr__,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                   *vslist,uint32_t indent)

{
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  iterator iVar4;
  uint32_t uVar5;
  _Rb_tree_header *in_RCX;
  uint32_t n;
  uint32_t extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long lVar6;
  long extraout_RDX_01;
  _Rb_tree_node_base *p_Var7;
  undefined1 in_R8B;
  _Base_ptr p_Var8;
  size_t i_1;
  _Base_ptr p_Var9;
  size_t i;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  allocator local_261;
  uint local_260;
  uint local_25c;
  _Rb_tree_node_base *local_258;
  string *local_250;
  ulong local_248;
  _Rb_tree_node_base *local_240;
  _Rb_tree_node_base *local_238;
  _Rb_tree_node_base *local_230;
  token nameTok;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  primNameTable;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  uVar10 = (ulong)indent;
  local_250 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  auVar12._8_8_ = extraout_RDX;
  auVar12._0_8_ = (vslist->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_240 = (_Rb_tree_node_base *)&(vslist->_M_t)._M_impl.super__Rb_tree_header;
  local_25c = indent + 1;
  local_260 = indent + 2;
  local_248 = uVar10;
  while( true ) {
    psVar1 = local_250;
    p_Var7 = auVar12._0_8_;
    if (p_Var7 == local_240) break;
    if (p_Var7[4]._M_parent != (_Base_ptr)0x0) {
      local_258 = p_Var7 + 1;
      pprint::Indent_abi_cxx11_
                ((string *)&primNameTable,(pprint *)(uVar10 & 0xffffffff),auVar12._8_4_);
      poVar3 = ::std::operator<<(local_1a8,(string *)&primNameTable);
      poVar3 = ::std::operator<<(poVar3,"variantSet ");
      ::std::__cxx11::string::string((string *)&local_1d8,"\"",&local_261);
      quote(&nameTok.str_,(string *)local_258,&local_1d8);
      poVar3 = ::std::operator<<(poVar3,(string *)&nameTok.str_);
      ::std::operator<<(poVar3," = {\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      auVar11._8_8_ = extraout_RDX_00;
      auVar11._0_8_ = p_Var7[3]._M_right;
      local_230 = (_Rb_tree_node_base *)&p_Var7[3]._M_parent;
      local_238 = p_Var7;
      while( true ) {
        uVar10 = local_248;
        p_Var7 = auVar11._0_8_;
        uVar5 = (uint32_t)in_RCX;
        if (p_Var7 == local_230) break;
        local_258 = p_Var7 + 1;
        pprint::Indent_abi_cxx11_((string *)&primNameTable,(pprint *)(ulong)local_25c,auVar11._8_4_)
        ;
        poVar3 = ::std::operator<<(local_1a8,(string *)&primNameTable);
        ::std::__cxx11::string::string((string *)&local_1d8,"\"",&local_261);
        quote(&nameTok.str_,(string *)local_258,&local_1d8);
        poVar3 = ::std::operator<<(poVar3,(string *)&nameTok.str_);
        ::std::operator<<(poVar3," ");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        bVar2 = PrimMetas::authored((PrimMetas *)&p_Var7[3]._M_left);
        if (bVar2) {
          ::std::operator<<(local_1a8,"(\n");
          print_prim_metas_abi_cxx11_
                    ((string *)&primNameTable,(tinyusdz *)&p_Var7[3]._M_left,
                     (PrimMeta *)(ulong)local_260,uVar5);
          ::std::operator<<(local_1a8,(string *)&primNameTable);
          ::std::__cxx11::string::_M_dispose();
          pprint::Indent_abi_cxx11_((string *)&primNameTable,(pprint *)(ulong)local_25c,n);
          poVar3 = ::std::operator<<(local_1a8,(string *)&primNameTable);
          ::std::operator<<(poVar3,") ");
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::operator<<(local_1a8,"{\n");
        print_props((string *)&primNameTable,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     *)(p_Var7 + 2),local_260);
        ::std::operator<<(local_1a8,(string *)&primNameTable);
        ::std::__cxx11::string::_M_dispose();
        p_Var9 = p_Var7[0x23]._M_parent;
        in_RCX = (_Rb_tree_header *)((long)p_Var7[0x1e]._M_right - (long)p_Var7[0x1e]._M_left >> 5);
        p_Var8 = p_Var7[0x23]._M_left;
        lVar6 = ((long)p_Var8 - (long)p_Var9) % 0x350;
        if (in_RCX == (_Rb_tree_header *)(((long)p_Var8 - (long)p_Var9) / 0x350)) {
          primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &primNameTable._M_t._M_impl.super__Rb_tree_header._M_header;
          primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          lVar6 = 0;
          primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (uVar10 = 0; in_RCX = (_Rb_tree_header *)0x350,
              uVar10 < (ulong)(((long)p_Var8 - (long)p_Var9) / 0x350); uVar10 = uVar10 + 1) {
            nameTok.str_._M_dataplus._M_p = (pointer)((long)&p_Var9->_M_color + lVar6);
            ::std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
            ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                        *)&primNameTable,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&p_Var9[0xd]._M_color + lVar6),(Prim **)&nameTok);
            p_Var9 = p_Var7[0x23]._M_parent;
            p_Var8 = p_Var7[0x23]._M_left;
            lVar6 = lVar6 + 0x350;
          }
          lVar6 = 0;
          for (uVar10 = 0;
              uVar10 < (ulong)((long)p_Var7[0x1e]._M_right - (long)p_Var7[0x1e]._M_left >> 5);
              uVar10 = uVar10 + 1) {
            ::std::__cxx11::string::string
                      ((string *)&nameTok.str_,
                       (string *)((long)&(p_Var7[0x1e]._M_left)->_M_color + lVar6));
            iVar4 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                            *)&primNameTable,&nameTok.str_);
            in_RCX = &primNameTable._M_t._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)iVar4._M_node != in_RCX) {
              in_RCX = (_Rb_tree_header *)0x1;
              value::pprint_value_abi_cxx11_
                        (&local_1d8,(value *)(*(long *)(iVar4._M_node + 2) + 0x298),
                         (Value *)(ulong)local_260,1,(bool)in_R8B);
              ::std::operator<<(local_1a8,(string *)&local_1d8);
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::string::_M_dispose();
            lVar6 = lVar6 + 0x20;
          }
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                       *)&primNameTable);
          uVar5 = extraout_EDX;
        }
        else {
          for (; uVar5 = (uint32_t)lVar6, p_Var9 != p_Var8;
              p_Var9 = (_Base_ptr)&p_Var9[0x1a]._M_left) {
            in_RCX = (_Rb_tree_header *)0x1;
            value::pprint_value_abi_cxx11_
                      ((string *)&primNameTable,(value *)&p_Var9[0x14]._M_right,
                       (Value *)(ulong)local_260,1,(bool)in_R8B);
            ::std::operator<<(local_1a8,(string *)&primNameTable);
            ::std::__cxx11::string::_M_dispose();
            lVar6 = extraout_RDX_01;
          }
        }
        pprint::Indent_abi_cxx11_((string *)&primNameTable,(pprint *)(ulong)local_25c,uVar5);
        poVar3 = ::std::operator<<(local_1a8,(string *)&primNameTable);
        ::std::operator<<(poVar3,"}\n");
        ::std::__cxx11::string::_M_dispose();
        auVar11 = ::std::_Rb_tree_increment(p_Var7);
      }
      pprint::Indent_abi_cxx11_
                ((string *)&primNameTable,(pprint *)(local_248 & 0xffffffff),auVar11._8_4_);
      poVar3 = ::std::operator<<(local_1a8,(string *)&primNameTable);
      ::std::operator<<(poVar3,"}\n");
      ::std::__cxx11::string::_M_dispose();
      p_Var7 = local_238;
    }
    auVar12 = ::std::_Rb_tree_increment(p_Var7);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return psVar1;
}

Assistant:

std::string print_variantSetStmt(
    const std::map<std::string, VariantSet> &vslist, const uint32_t indent) {
  std::stringstream ss;

  // ss << "# variantSet.size = " << std::to_string(vslist.size()) << "\n";
  for (const auto &variantSet : vslist) {
    if (variantSet.second.variantSet.empty()) {
      continue;
    }

    ss << pprint::Indent(indent) << "variantSet " << quote(variantSet.first)
       << " = {\n";

    for (const auto &item : variantSet.second.variantSet) {
      ss << pprint::Indent(indent + 1) << quote(item.first) << " ";

      if (item.second.metas().authored()) {
        ss << "(\n";
        ss << print_prim_metas(item.second.metas(), indent + 2);
        ss << pprint::Indent(indent + 1) << ") ";
      }

      ss << "{\n";

      // props
      ss << print_props(item.second.properties(), indent + 2);

      // primChildren
      // TODO: print child Prims based on `primChildren` Prim metadata
      const auto &variantPrimMetas = item.second.metas();
      const auto &variantPrimChildren = item.second.primChildren();

      if (variantPrimMetas.primChildren.size() == variantPrimChildren.size()) {
        std::map<std::string, const Prim *> primNameTable;
        for (size_t i = 0; i < variantPrimChildren.size(); i++) {
          primNameTable.emplace(variantPrimChildren[i].element_name(),
                                &variantPrimChildren[i]);
        }

        for (size_t i = 0; i < variantPrimMetas.primChildren.size(); i++) {
          value::token nameTok = variantPrimMetas.primChildren[i];
          DCOUT(fmt::format("variantPrimChildren  {}/{} = {}", i,
                            variantPrimMetas.primChildren.size(),
                            nameTok.str()));
          const auto it = primNameTable.find(nameTok.str());
          if (it != primNameTable.end()) {
            ss << pprint_value(it->second->data(), indent + 2,
                               /* closing_brace */ true);
          } else {
            // TODO: Report warning?
          }
        }
      } else {
        for (const auto &child : variantPrimChildren) {
          ss << pprint_value(child.data(), indent + 2,
                             /* closing_brace */ true);
        }
      }

      // ss << "# variantSet end\n";
      ss << pprint::Indent(indent + 1) << "}\n";
    }

    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}